

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

Translate * __thiscall
SleighArchitecture::buildTranslator(SleighArchitecture *this,DocumentStorage *store)

{
  bool bVar1;
  Sleigh *this_00;
  DocumentStorage *store_local;
  SleighArchitecture *this_local;
  
  bVar1 = isTranslateReused(this);
  if (bVar1) {
    Sleigh::reset(last_sleigh,(this->super_Architecture).loader,(this->super_Architecture).context);
  }
  else {
    this_00 = (Sleigh *)operator_new(0x260);
    Sleigh::Sleigh(this_00,(this->super_Architecture).loader,(this->super_Architecture).context);
    last_languageindex = *(int4 *)&(this->super_Architecture).field_0x3a4;
    last_sleigh = this_00;
  }
  return (Translate *)last_sleigh;
}

Assistant:

Translate *SleighArchitecture::buildTranslator(DocumentStorage &store)

{				// Build a sleigh translator
  if (isTranslateReused()) {
    last_sleigh->reset(loader,context);
    return last_sleigh;
  }
  else {
    last_sleigh = new Sleigh(loader,context);
    last_languageindex = languageindex;
    return last_sleigh;
  }
}